

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void pxa262_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  *(ushort *)(obj[1].tb_jmp_cache + 0x5f3) = *(ushort *)(obj[1].tb_jmp_cache + 0x5f3) | 0x8002;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x69052d06;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x780d172172;
  return;
}

Assistant:

static void pxa262_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V5);
    set_feature(&cpu->env, ARM_FEATURE_XSCALE);
    cpu->midr = 0x69052d06;
    cpu->ctr = 0xd172172;
    cpu->reset_sctlr = 0x00000078;
}